

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O2

bool __thiscall ON_ClippingPlane::Write(ON_ClippingPlane *this,ON_BinaryArchive *file)

{
  ON_UuidList *pOVar1;
  double x;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ON_UUID *pOVar5;
  ON_ClippingPlaneData *pOVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ON_UUID model_component_id;
  ON_UUID viewport_id;
  
  bVar2 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,5);
  if (!bVar2) {
    return false;
  }
  viewport_id.Data1 = 0;
  viewport_id.Data2 = 0;
  viewport_id.Data3 = 0;
  viewport_id.Data4[0] = '\0';
  viewport_id.Data4[1] = '\0';
  viewport_id.Data4[2] = '\0';
  viewport_id.Data4[3] = '\0';
  viewport_id.Data4[4] = '\0';
  viewport_id.Data4[5] = '\0';
  viewport_id.Data4[6] = '\0';
  viewport_id.Data4[7] = '\0';
  pOVar1 = &this->m_viewport_ids;
  iVar3 = ON_UuidList::Count(pOVar1);
  if (0 < iVar3) {
    pOVar5 = ON_UuidList::Array(pOVar1);
    viewport_id.Data1 = pOVar5->Data1;
    viewport_id.Data2 = pOVar5->Data2;
    viewport_id.Data3 = pOVar5->Data3;
    viewport_id.Data4 = *&pOVar5->Data4;
  }
  bVar2 = ON_BinaryArchive::WriteUuid(file,&viewport_id);
  if ((((bVar2) && (bVar2 = ON_BinaryArchive::WriteUuid(file,&this->m_plane_id), bVar2)) &&
      (bVar2 = ON_BinaryArchive::WritePlane(file,&this->m_plane), bVar2)) &&
     ((bVar2 = ON_BinaryArchive::WriteBool(file,this->m_bEnabled), bVar2 &&
      (bVar2 = ON_UuidList::Write(pOVar1,file), bVar2)))) {
    x = Depth(this);
    bVar2 = ON_BinaryArchive::WriteDouble(file,x);
    if ((bVar2) && (bVar2 = ON_BinaryArchive::WriteBool(file,this->m_depth_enabled), bVar2)) {
      pOVar6 = GetClippingPlaneData((this->m_data_store).m_sn);
      if (pOVar6 == (ON_ClippingPlaneData *)0x0) {
LAB_0057baa2:
        if ((this->m_participation_lists_enabled != true) ||
           ((bVar2 = ON_BinaryArchive::WriteChar(file,'\r'), bVar2 &&
            (bVar2 = ON_BinaryArchive::WriteBool(file,this->m_participation_lists_enabled), bVar2)))
           ) {
          bVar2 = ON_BinaryArchive::WriteChar(file,'\0');
          uVar10 = (ulong)bVar2;
          goto LAB_0057bb01;
        }
      }
      else {
        pOVar1 = &pOVar6->m_object_id_list;
        iVar3 = ON_UuidList::Count(pOVar1);
        if ((iVar3 < 1) || (pOVar5 = ON_UuidList::Array(pOVar1), pOVar5 == (ON_UUID *)0x0)) {
LAB_0057ba3b:
          if ((pOVar6->m_layer_list).m_count < 1) {
LAB_0057ba9b:
            if ((pOVar6->m_is_exclusion_list != false) ||
               ((bVar2 = ON_BinaryArchive::WriteChar(file,'\f'), bVar2 &&
                (bVar2 = ON_BinaryArchive::WriteBool(file,pOVar6->m_is_exclusion_list), bVar2))))
            goto LAB_0057baa2;
          }
          else {
            bVar2 = ON_BinaryArchive::WriteChar(file,'\v');
            if (bVar2) {
              uVar4 = (pOVar6->m_layer_list).m_count;
              bVar2 = ON_BinaryArchive::WriteInt(file,uVar4);
              uVar10 = 0;
              if (bVar2) {
                uVar8 = (ulong)uVar4;
                if ((int)uVar4 < 1) {
                  uVar8 = uVar10;
                }
                uVar9 = 0;
                do {
                  if (uVar8 == uVar9) goto LAB_0057ba9b;
                  bVar2 = ON_BinaryArchive::Write3dmReferencedComponentIndex
                                    (file,Layer,(pOVar6->m_layer_list).m_a[uVar9]);
                  uVar9 = uVar9 + 1;
                  uVar10 = 0;
                } while (bVar2);
              }
              goto LAB_0057bb01;
            }
          }
        }
        else {
          bVar2 = ON_BinaryArchive::WriteChar(file,'\n');
          if (bVar2) {
            uVar4 = ON_UuidList::Count(pOVar1);
            bVar2 = ON_BinaryArchive::WriteInt(file,uVar4);
            uVar10 = 0;
            if (bVar2) {
              uVar8 = (ulong)uVar4;
              if ((int)uVar4 < 1) {
                uVar8 = uVar10;
              }
              lVar7 = 0;
              do {
                if (uVar8 * 0x10 + 0x10 == lVar7 + 0x10) goto LAB_0057ba3b;
                model_component_id.Data4 = *(uchar (*) [8])(pOVar5->Data4 + lVar7);
                model_component_id._0_8_ = *(undefined8 *)(pOVar5->Data4 + lVar7 + -8);
                bVar2 = ON_BinaryArchive::Write3dmReferencedComponentId
                                  (file,ModelGeometry,model_component_id);
                uVar10 = 0;
                lVar7 = lVar7 + 0x10;
              } while (bVar2);
            }
            goto LAB_0057bb01;
          }
        }
      }
    }
  }
  uVar10 = 0;
LAB_0057bb01:
  bVar2 = ON_BinaryArchive::EndWrite3dmChunk(file);
  return (bool)(bVar2 & (byte)uVar10);
}

Assistant:

bool ON_ClippingPlane::Write( ON_BinaryArchive& file ) const
{
  // 20 May 2023 S. Baer (RH-74763)
  // version 1.5 - write clip participation
  bool rc = file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,5);
  if (!rc)
    return false;

  for(;;)
  {
    //version 1.1 - write list of viewport uuids instead of single uuid
    ON_UUID viewport_id = ::ON_nil_uuid;
    if( m_viewport_ids.Count() > 0 )
      viewport_id = *(m_viewport_ids.Array());
    rc = file.WriteUuid(viewport_id);
    if (!rc) break;

    rc = file.WriteUuid(m_plane_id);
    if (!rc) break;

    rc = file.WritePlane(m_plane);
    if (!rc) break;

    rc = file.WriteBool(m_bEnabled);
    if (!rc) break;

    //version 1.1 - write list of viewport uuids instead of single uuid
    rc = m_viewport_ids.Write(file);
    if (!rc) break;

    //version 1.2 - write distance as double
    //version 1.3 - continue to write distance, but the reader now knows to
    //              interpret the distance value in a different way
    double depth = Depth();
    rc = file.WriteDouble(depth);
    if (!rc) break;

    //version 1.4 - write enabled flag for depth
    rc = file.WriteBool(m_depth_enabled);
    if (!rc) break;

    //version 1.5
    ON_ClippingPlaneData* data = GetClippingPlaneData(m_data_store.m_sn);

    if (data && data->m_object_id_list.Count() > 0)
    {
      const ON_UUID* ids = data->m_object_id_list.Array();
      if (ids)
      {
        unsigned char c = ON_ClippingPlaneTypeCodes::ClipParticipationObjectList; // 10
        rc = file.WriteChar(c);
        if (!rc) break;

        int count = data->m_object_id_list.Count();
        rc = file.WriteInt(count);
        if (!rc) break;

        for (int i = 0; i < count; i++)
        {
          rc = file.Write3dmReferencedComponentId(ON_ModelComponent::Type::ModelGeometry, ids[i]);
          if (!rc) break;
        }
        if (!rc) break;
      }
    }
    if (data && data->m_layer_list.Count() > 0)
    {
      unsigned char c = ON_ClippingPlaneTypeCodes::ClipParticipationLayerList; // 11
      rc = file.WriteChar(c);
      if (!rc) break;

      int count = data->m_layer_list.Count();
      rc = file.WriteInt(count);
      if (!rc) break;
      for (int i = 0; i < count; i++)
      {
        int layer_index = data->m_layer_list[i];
        rc = file.Write3dmReferencedComponentIndex(ON_ModelComponent::Type::Layer, layer_index);
        if (!rc) break;
      }
      if (!rc) break;
    }
    if (data && data->m_is_exclusion_list == false)
    {
      unsigned char c = ON_ClippingPlaneTypeCodes::ClipParticipationIsExclusion; // 12
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteBool(data->m_is_exclusion_list);
      if (!rc) break;
    }
    if (m_participation_lists_enabled)
    {
      unsigned char c = ON_ClippingPlaneTypeCodes::ClipParticipationEnabled; // 13
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteBool(m_participation_lists_enabled);
      if (!rc) break;
    }

    unsigned char lastTypeCode = 0;
    rc = file.WriteChar(lastTypeCode);
    break;
  }

  if ( !file.EndWrite3dmChunk() )
    rc = false;

  return rc;
}